

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
perfetto::internal::InProcessTracingBackend::~InProcessTracingBackend(InProcessTracingBackend *this)

{
  InProcessTracingBackend *this_local;
  
  (this->super_TracingBackend)._vptr_TracingBackend =
       (_func_int **)&PTR__InProcessTracingBackend_009c2a70;
  std::unique_ptr<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>::
  ~unique_ptr(&this->service_);
  TracingBackend::~TracingBackend(&this->super_TracingBackend);
  return;
}

Assistant:

class PERFETTO_EXPORT_COMPONENT InProcessTracingBackend
    : public TracingBackend {
 public:
  static TracingBackend* GetInstance();

  // TracingBackend implementation.
  std::unique_ptr<ProducerEndpoint> ConnectProducer(
      const ConnectProducerArgs&) override;
  std::unique_ptr<ConsumerEndpoint> ConnectConsumer(
      const ConnectConsumerArgs&) override;

 private:
  InProcessTracingBackend();
  TracingService* GetOrCreateService(base::TaskRunner*);

  std::unique_ptr<TracingService> service_;
}